

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adsc.c
# Opt level: O0

void la_adsc_vspd_change_format_text(la_adsc_formatter_ctx_t *ctx,char *label,void *data)

{
  int iVar1;
  int *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 uVar2;
  la_adsc_vspd_chg_event_t *e;
  
  uVar2 = 0x3c;
  if (-1 < *in_RDX) {
    uVar2 = 0x3e;
  }
  iVar1 = *in_RDX;
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  la_vstring_append_sprintf
            ((la_vstring *)*in_RDI,"%*s%s: %c%d ft/min\n",(ulong)*(uint *)(in_RDI + 1),"",in_RSI,
             uVar2,iVar1);
  return;
}

Assistant:

LA_ADSC_FORMATTER_FUN(la_adsc_vspd_change_format_text) {
	la_adsc_vspd_chg_event_t const *e = data;
	LA_ISPRINTF(ctx->vstr, ctx->indent,
			"%s: %c%d ft/min\n",
			label,
			e->vspd_threshold >= 0 ? '>' : '<',
			abs(e->vspd_threshold)
			);
}